

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::LinkNextPlotLimits
               (double *xmin,double *xmax,double *ymin,double *ymax,double *ymin2,double *ymax2,
               double *ymin3,double *ymax3)

{
  ImPlotContext *pIVar1;
  
  pIVar1 = GImPlot;
  (GImPlot->NextPlotData).LinkedXmin = xmin;
  (pIVar1->NextPlotData).LinkedXmax = xmax;
  (pIVar1->NextPlotData).LinkedYmin[0] = ymin;
  (pIVar1->NextPlotData).LinkedYmax[0] = ymax;
  (pIVar1->NextPlotData).LinkedYmin[1] = ymin2;
  (pIVar1->NextPlotData).LinkedYmax[1] = ymax2;
  (pIVar1->NextPlotData).LinkedYmin[2] = ymin3;
  (pIVar1->NextPlotData).LinkedYmax[2] = ymax3;
  return;
}

Assistant:

void LinkNextPlotLimits(double* xmin, double* xmax, double* ymin, double* ymax, double* ymin2, double* ymax2, double* ymin3, double* ymax3) {
    ImPlotContext& gp = *GImPlot;
    gp.NextPlotData.LinkedXmin    = xmin;
    gp.NextPlotData.LinkedXmax    = xmax;
    gp.NextPlotData.LinkedYmin[0] = ymin;
    gp.NextPlotData.LinkedYmax[0] = ymax;
    gp.NextPlotData.LinkedYmin[1] = ymin2;
    gp.NextPlotData.LinkedYmax[1] = ymax2;
    gp.NextPlotData.LinkedYmin[2] = ymin3;
    gp.NextPlotData.LinkedYmax[2] = ymax3;
}